

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O0

mbedtls_pk_type_t mbedtls_ssl_get_ciphersuite_sig_pk_alg(mbedtls_ssl_ciphersuite_t *info)

{
  mbedtls_key_exchange_type_t mVar1;
  mbedtls_ssl_ciphersuite_t *info_local;
  
  mVar1 = info->key_exchange;
  if (2 < mVar1 - MBEDTLS_KEY_EXCHANGE_RSA) {
    if (mVar1 == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA) {
      return MBEDTLS_PK_ECDSA;
    }
    if (mVar1 != MBEDTLS_KEY_EXCHANGE_RSA_PSK) {
      if (1 < mVar1 - MBEDTLS_KEY_EXCHANGE_ECDH_RSA) {
        return MBEDTLS_PK_NONE;
      }
      return MBEDTLS_PK_ECKEY;
    }
  }
  return MBEDTLS_PK_RSA;
}

Assistant:

mbedtls_pk_type_t mbedtls_ssl_get_ciphersuite_sig_pk_alg( const mbedtls_ssl_ciphersuite_t *info )
{
    switch( info->key_exchange )
    {
        case MBEDTLS_KEY_EXCHANGE_RSA:
        case MBEDTLS_KEY_EXCHANGE_DHE_RSA:
        case MBEDTLS_KEY_EXCHANGE_ECDHE_RSA:
        case MBEDTLS_KEY_EXCHANGE_RSA_PSK:
            return( MBEDTLS_PK_RSA );

        case MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA:
            return( MBEDTLS_PK_ECDSA );

        case MBEDTLS_KEY_EXCHANGE_ECDH_RSA:
        case MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA:
            return( MBEDTLS_PK_ECKEY );

        default:
            return( MBEDTLS_PK_NONE );
    }
}